

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_add_hex_as_tet(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  long local_318;
  long local_308;
  long local_300;
  long local_2f0;
  long local_2e8;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_278;
  REF_GLOB local_270;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tet_nodes [27];
  REF_INT n;
  REF_INT deg;
  REF_INT face2;
  REF_INT face1;
  REF_INT face0;
  REF_INT I [27];
  REF_GLOB global [27];
  REF_GLOB minnode;
  REF_INT node;
  REF_INT *nodes_local;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  
  for (minnode._4_4_ = 0; minnode._4_4_ < 8; minnode._4_4_ = minnode._4_4_ + 1) {
    if (((nodes[minnode._4_4_] < 0) || (ref_node->max <= nodes[minnode._4_4_])) ||
       (ref_node->global[nodes[minnode._4_4_]] < 0)) {
      local_270 = -1;
    }
    else {
      local_270 = ref_node->global[nodes[minnode._4_4_]];
    }
    *(REF_GLOB *)(I + (long)minnode._4_4_ * 2 + 0x1a) = local_270;
  }
  if (stack0xfffffffffffffee8 < global[0]) {
    local_278 = stack0xfffffffffffffee8;
  }
  else {
    local_278 = global[0];
  }
  if (global[1] < global[2]) {
    local_288 = global[1];
  }
  else {
    local_288 = global[2];
  }
  if (local_278 < local_288) {
    if (stack0xfffffffffffffee8 < global[0]) {
      local_290 = stack0xfffffffffffffee8;
    }
    else {
      local_290 = global[0];
    }
    local_298 = local_290;
  }
  else {
    if (global[1] < global[2]) {
      local_2a0 = global[1];
    }
    else {
      local_2a0 = global[2];
    }
    local_298 = local_2a0;
  }
  if (global[3] < global[4]) {
    local_2a8 = global[3];
  }
  else {
    local_2a8 = global[4];
  }
  if (local_2a8 < local_298) {
    if (global[3] < global[4]) {
      local_2b0 = global[3];
    }
    else {
      local_2b0 = global[4];
    }
    local_2b8 = local_2b0;
  }
  else {
    local_2b8 = local_298;
  }
  if (global[5] < global[6]) {
    local_2c0 = global[5];
  }
  else {
    local_2c0 = global[6];
  }
  if (local_2c0 < local_2b8) {
    if (global[5] < global[6]) {
      local_2c8 = global[5];
    }
    else {
      local_2c8 = global[6];
    }
    local_2d0 = local_2c8;
  }
  else {
    local_2d0 = local_2b8;
  }
  I[0] = 2;
  I[1] = 3;
  I[2] = 4;
  I[3] = 5;
  I[4] = 6;
  I[5] = 7;
  bVar4 = global[0] == local_2d0;
  if (bVar4) {
    I[0] = 4;
    I[1] = 5;
    I[2] = 2;
    I[3] = 3;
    I[4] = 7;
    I[5] = 6;
  }
  face0 = (REF_INT)!bVar4;
  face1 = (REF_INT)bVar4;
  if (global[1] == local_2d0) {
    face1 = 2;
    face0 = 1;
    I[0] = 5;
    I[1] = 6;
    I[2] = 3;
    I[3] = 0;
    I[4] = 4;
    I[5] = 7;
  }
  if (global[2] == local_2d0) {
    face1 = 3;
    face0 = 0;
    I[0] = 1;
    I[1] = 2;
    I[2] = 7;
    I[3] = 4;
    I[4] = 5;
    I[5] = 6;
  }
  if (global[3] == local_2d0) {
    face1 = 4;
    face0 = 0;
    I[0] = 3;
    I[1] = 7;
    I[2] = 5;
    I[3] = 1;
    I[4] = 2;
    I[5] = 6;
  }
  if (global[4] == local_2d0) {
    face1 = 5;
    face0 = 1;
    I[0] = 0;
    I[1] = 4;
    I[2] = 6;
    I[3] = 2;
    I[4] = 3;
    I[5] = 7;
  }
  if (global[5] == local_2d0) {
    face1 = 6;
    face0 = 2;
    I[0] = 1;
    I[1] = 5;
    I[2] = 7;
    I[3] = 3;
    I[4] = 0;
    I[5] = 4;
  }
  if (global[6] == local_2d0) {
    face1 = 7;
    face0 = 3;
    I[0] = 2;
    I[1] = 6;
    I[2] = 4;
    I[3] = 0;
    I[4] = 1;
    I[5] = 5;
  }
  if (*(long *)(I + (long)face0 * 2 + 0x1a) < *(long *)(I + (long)I[4] * 2 + 0x1a)) {
    local_2d8 = *(long *)(I + (long)face0 * 2 + 0x1a);
  }
  else {
    local_2d8 = *(long *)(I + (long)I[4] * 2 + 0x1a);
  }
  if (*(long *)(I + (long)I[0] * 2 + 0x1a) < *(long *)(I + (long)I[3] * 2 + 0x1a)) {
    local_2e8 = *(long *)(I + (long)I[0] * 2 + 0x1a);
  }
  else {
    local_2e8 = *(long *)(I + (long)I[3] * 2 + 0x1a);
  }
  uVar3 = (uint)(local_2d8 < local_2e8);
  if (*(long *)(I + (long)I[1] * 2 + 0x1a) < *(long *)(I + (long)I[4] * 2 + 0x1a)) {
    local_2f0 = *(long *)(I + (long)I[1] * 2 + 0x1a);
  }
  else {
    local_2f0 = *(long *)(I + (long)I[4] * 2 + 0x1a);
  }
  if (*(long *)(I + (long)I[0] * 2 + 0x1a) < *(long *)(I + (long)I[5] * 2 + 0x1a)) {
    local_300 = *(long *)(I + (long)I[0] * 2 + 0x1a);
  }
  else {
    local_300 = *(long *)(I + (long)I[5] * 2 + 0x1a);
  }
  uVar1 = (uint)(local_2f0 < local_300);
  if (*(long *)(I + (long)I[2] * 2 + 0x1a) < *(long *)(I + (long)I[4] * 2 + 0x1a)) {
    local_308 = *(long *)(I + (long)I[2] * 2 + 0x1a);
  }
  else {
    local_308 = *(long *)(I + (long)I[4] * 2 + 0x1a);
  }
  if (*(long *)(I + (long)I[3] * 2 + 0x1a) < *(long *)(I + (long)I[5] * 2 + 0x1a)) {
    local_318 = *(long *)(I + (long)I[3] * 2 + 0x1a);
  }
  else {
    local_318 = *(long *)(I + (long)I[5] * 2 + 0x1a);
  }
  uVar2 = (uint)(local_308 < local_318);
  tet_nodes[0x1a] = 0;
  if (((uVar3 == 0) && (uVar1 == 0)) && (uVar2 == 1)) {
    tet_nodes[0x1a] = 0x78;
  }
  if (((uVar3 == 0) && (uVar1 == 1)) && (uVar2 == 0)) {
    tet_nodes[0x1a] = 0xf0;
  }
  if (((uVar3 == 0) && (uVar1 == 1)) && (uVar2 == 1)) {
    tet_nodes[0x1a] = 0;
  }
  if (((uVar3 == 1) && (uVar1 == 0)) && (uVar2 == 0)) {
    tet_nodes[0x1a] = 0;
  }
  if (((uVar3 == 1) && (uVar1 == 0)) && (uVar2 == 1)) {
    tet_nodes[0x1a] = 0xf0;
  }
  if (((uVar3 == 1) && (uVar1 == 1)) && (uVar2 == 0)) {
    tet_nodes[0x1a] = 0x78;
  }
  if (((uVar3 == 1) && (uVar1 == 1)) && (uVar2 == 1)) {
    tet_nodes[0x1a] = 0;
  }
  if (tet_nodes[0x1a] == 0x78) {
    ref_shard_permute_hex_120(&face1);
  }
  if (tet_nodes[0x1a] == 0xf0) {
    ref_shard_permute_hex_120(&face1);
    ref_shard_permute_hex_120(&face1);
  }
  tet_nodes[0x19] = uVar3 + uVar1 + uVar2;
  switch(tet_nodes[0x19]) {
  case 0:
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[face0];
    tet_nodes[0] = nodes[I[0]];
    tet_nodes[1] = nodes[I[3]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x314
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[0]];
    tet_nodes[0] = nodes[I[5]];
    tet_nodes[1] = nodes[I[3]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x319
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[0]];
    tet_nodes[0] = nodes[I[1]];
    tet_nodes[1] = nodes[I[5]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x31e
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[3]];
    tet_nodes[0] = nodes[I[5]];
    tet_nodes[1] = nodes[I[2]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x323
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[I[0]];
    ref_private_macro_code_rss = nodes[I[5]];
    tet_nodes[0] = nodes[I[3]];
    tet_nodes[1] = nodes[I[4]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x328
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    break;
  case 1:
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[3]];
    tet_nodes[0] = nodes[I[5]];
    tet_nodes[1] = nodes[I[2]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x330
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[face0];
    tet_nodes[0] = nodes[I[5]];
    tet_nodes[1] = nodes[I[3]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x335
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face0];
    ref_private_macro_code_rss = nodes[I[4]];
    tet_nodes[0] = nodes[I[5]];
    tet_nodes[1] = nodes[I[3]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x33a
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[5]];
    tet_nodes[0] = nodes[I[0]];
    tet_nodes[1] = nodes[I[1]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x33f
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[5]];
    tet_nodes[0] = nodes[face0];
    tet_nodes[1] = nodes[I[0]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x344
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face0];
    ref_private_macro_code_rss = nodes[I[5]];
    tet_nodes[0] = nodes[I[4]];
    tet_nodes[1] = nodes[I[0]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x349
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    break;
  case 2:
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[2]];
    tet_nodes[0] = nodes[I[3]];
    tet_nodes[1] = nodes[I[4]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x350
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[1]];
    tet_nodes[0] = nodes[I[5]];
    tet_nodes[1] = nodes[I[4]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x355
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[5]];
    tet_nodes[0] = nodes[I[2]];
    tet_nodes[1] = nodes[I[4]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x35a
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[face0];
    tet_nodes[0] = nodes[I[0]];
    tet_nodes[1] = nodes[I[3]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x35f
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[1]];
    tet_nodes[0] = nodes[I[4]];
    tet_nodes[1] = nodes[I[0]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x364
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[4]];
    tet_nodes[0] = nodes[I[3]];
    tet_nodes[1] = nodes[I[0]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x369
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    break;
  case 3:
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[0]];
    tet_nodes[0] = nodes[I[1]];
    tet_nodes[1] = nodes[I[4]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x370
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[1]];
    tet_nodes[0] = nodes[I[5]];
    tet_nodes[1] = nodes[I[4]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x375
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[5]];
    tet_nodes[0] = nodes[I[2]];
    tet_nodes[1] = nodes[I[4]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x37a
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face1];
    ref_private_macro_code_rss = nodes[I[3]];
    tet_nodes[0] = nodes[I[4]];
    tet_nodes[1] = nodes[I[2]];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x37f
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face0];
    ref_private_macro_code_rss = nodes[I[3]];
    tet_nodes[0] = nodes[I[4]];
    tet_nodes[1] = nodes[face1];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",900,
             "ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    ref_private_macro_code_rss_1 = nodes[face0];
    ref_private_macro_code_rss = nodes[I[4]];
    tet_nodes[0] = nodes[I[0]];
    tet_nodes[1] = nodes[face1];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&ref_private_macro_code_rss_1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x389
             ,"ref_shard_add_hex_as_tet",(ulong)uVar3,"a tet");
      return uVar3;
    }
    break;
  default:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x38c,
           "ref_shard_add_hex_as_tet",6,"should be 0-3");
    printf("n %d\n",(ulong)(uint)tet_nodes[0x19]);
    return 6;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_hex_as_tet(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes) {
  REF_INT node;
  REF_GLOB minnode, global[REF_CELL_MAX_SIZE_PER];
  REF_INT I[REF_CELL_MAX_SIZE_PER];
  REF_INT face0, face1, face2, deg, n;
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];

  for (node = 0; node < 8; node++)
    global[node] = ref_node_global(ref_node, nodes[node]);

  /* permutaion with node 0 the smallest global index of the hex */

  minnode = MIN(MIN(global[0], global[1]), MIN(global[2], global[3]));
  minnode = MIN(MIN(global[4], global[5]), minnode);
  minnode = MIN(MIN(global[6], global[7]), minnode);

  I[0] = 0;
  I[1] = 1;
  I[2] = 2;
  I[3] = 3;
  I[4] = 4;
  I[5] = 5;
  I[6] = 6;
  I[7] = 7;
  if (global[1] == minnode) {
    I[0] = 1;
    I[1] = 0;
    I[2] = 4;
    I[3] = 5;
    I[4] = 2;
    I[5] = 3;
    I[6] = 7;
    I[7] = 6;
  }
  if (global[2] == minnode) {
    I[0] = 2;
    I[1] = 1;
    I[2] = 5;
    I[3] = 6;
    I[4] = 3;
    I[5] = 0;
    I[6] = 4;
    I[7] = 7;
  }
  if (global[3] == minnode) {
    I[0] = 3;
    I[1] = 0;
    I[2] = 1;
    I[3] = 2;
    I[4] = 7;
    I[5] = 4;
    I[6] = 5;
    I[7] = 6;
  }
  if (global[4] == minnode) {
    I[0] = 4;
    I[1] = 0;
    I[2] = 3;
    I[3] = 7;
    I[4] = 5;
    I[5] = 1;
    I[6] = 2;
    I[7] = 6;
  }
  if (global[5] == minnode) {
    I[0] = 5;
    I[1] = 1;
    I[2] = 0;
    I[3] = 4;
    I[4] = 6;
    I[5] = 2;
    I[6] = 3;
    I[7] = 7;
  }
  if (global[6] == minnode) {
    I[0] = 6;
    I[1] = 2;
    I[2] = 1;
    I[3] = 5;
    I[4] = 7;
    I[5] = 3;
    I[6] = 0;
    I[7] = 4;
  }
  if (global[7] == minnode) {
    I[0] = 7;
    I[1] = 3;
    I[2] = 2;
    I[3] = 6;
    I[4] = 4;
    I[5] = 0;
    I[6] = 1;
    I[7] = 5;
  }

  /* find the faces with diag toward I[7]*/
  face0 = MIN(global[I[1]], global[I[6]]) < MIN(global[I[2]], global[I[5]]);
  face1 = MIN(global[I[3]], global[I[6]]) < MIN(global[I[2]], global[I[7]]);
  face2 = MIN(global[I[4]], global[I[6]]) < MIN(global[I[5]], global[I[7]]);
  deg = 0; /* table 5 */
  if (0 == face0 && 0 == face1 && 0 == face2) deg = 0;
  if (0 == face0 && 0 == face1 && 1 == face2) deg = 120;
  if (0 == face0 && 1 == face1 && 0 == face2) deg = 240;
  if (0 == face0 && 1 == face1 && 1 == face2) deg = 0;
  if (1 == face0 && 0 == face1 && 0 == face2) deg = 0;
  if (1 == face0 && 0 == face1 && 1 == face2) deg = 240;
  if (1 == face0 && 1 == face1 && 0 == face2) deg = 120;
  if (1 == face0 && 1 == face1 && 1 == face2) deg = 0;
  if (120 == deg) {
    ref_shard_permute_hex_120(I);
  }
  if (240 == deg) {
    ref_shard_permute_hex_120(I);
    ref_shard_permute_hex_120(I);
  }

  n = face0 + face1 + face2;

  switch (n) {
    case 0:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[1]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[2]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[2]];
      tet_nodes[2] = nodes[I[3]];
      tet_nodes[3] = nodes[I[7]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[4]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[2]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[5]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      /* n=0 has 5 tets */
      break;
    case 1:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[4]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[1]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[6]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[3]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[1]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      break;
    case 2:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[4]];
      tet_nodes[2] = nodes[I[5]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[3]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[4]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[1]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[3]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[6]];
      tet_nodes[2] = nodes[I[5]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      break;
    case 3:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[2]];
      tet_nodes[2] = nodes[I[3]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[3]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[4]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[4]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[0]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[6]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[0]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      break;
    default:
      RSB(REF_IMPLEMENT, "should be 0-3", printf("n %d\n", n););
      break;
  }

  return REF_SUCCESS;
}